

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef rec_upvalue(jit_State *J,uint32_t uv,TRef val)

{
  GCupval *uvp_00;
  undefined8 *puVar1;
  bool bVar2;
  ushort uVar3;
  ushort uVar4;
  IRRef1 IVar5;
  TRef TVar6;
  int iVar7;
  TRef TVar8;
  uint uVar9;
  uint uVar10;
  TRef local_144;
  TRef local_124;
  TRef res;
  IRType t_1;
  IRType t;
  int32_t slot;
  TRef kfunc;
  TRef tr;
  int needbarrier;
  IRRef uref;
  TRef fn;
  GCupval *uvp;
  TRef val_local;
  uint32_t uv_local;
  jit_State *J_local;
  uint local_14;
  
  uvp_00 = *(GCupval **)((long)J->fn + (ulong)uv * 8 + 0x28);
  TVar6 = getcurrf(J);
  bVar2 = false;
  iVar7 = rec_upvalue_constify(J,uvp_00);
  needbarrier = TVar6;
  if (iVar7 != 0) {
    if (0x7fff < (TVar6 & 0xffff)) {
      if (0x5f < J->pt->flags) goto LAB_00199c3a;
      needbarrier = lj_ir_kgc(J,(GCobj *)J->fn,IRT_FUNC);
      (J->fold).ins.field_0.ot = 0x888;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
      (J->fold).ins.field_0.op2 = (IRRef1)needbarrier;
      lj_opt_fold(J);
      J->base[-2] = needbarrier;
    }
    TVar6 = lj_record_constify(J,(cTValue *)(uvp_00->v).ptr64);
    if (TVar6 != 0) {
      return TVar6;
    }
  }
LAB_00199c3a:
  uVar9 = uvp_00->dhash + 0xfb3ee249;
  uVar10 = uVar9 * 0x4000 | uVar9 >> 0x12;
  iVar7 = (uVar9 ^ uvp_00->dhash) - uVar10;
  uVar3 = (ushort)(uv << 8) |
          ((ushort)iVar7 ^ ((ushort)(uVar10 << 5) | (ushort)(uVar9 * 0x4000 >> 0x1b))) -
          (ushort)((uint)iVar7 >> 0x13) & 0xff;
  IVar5 = (IRRef1)needbarrier;
  if (uvp_00->closed == '\0') {
    if ((((J->L->stack).ptr64 <= (uvp_00->v).ptr64) && ((uvp_00->v).ptr64 < (J->L->maxstack).ptr64))
       && (iVar7 = (int)((long)((uvp_00->v).ptr64 - (long)(J->L->base + -(ulong)J->baseslot)) >> 3),
          -1 < iVar7)) {
      (J->fold).ins.field_0.ot = 0x3c09;
      (J->fold).ins.field_0.op1 = IVar5;
      (J->fold).ins.field_0.op2 = uVar3;
      TVar6 = lj_opt_fold(J);
      TVar8 = lj_ir_kint64(J,(long)((iVar7 + -2) * -8));
      (J->fold).ins.field_0.ot = 0x2909;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
      TVar6 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x889;
      (J->fold).ins.field_0.op1 = 0x8000;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
      lj_opt_fold(J);
      iVar7 = iVar7 - J->baseslot;
      if (val == 0) {
        if (J->base[iVar7] == 0) {
          local_144 = sload(J,iVar7);
        }
        else {
          local_144 = J->base[iVar7];
        }
        return local_144;
      }
      J->base[iVar7] = val;
      if ((int)J->maxslot <= iVar7) {
        J->maxslot = iVar7 + 1;
      }
      return 0;
    }
    uVar4 = 0x15;
    if ((val >> 0x18 & 0x1f) - 4 < 9) {
      uVar4 = 9;
    }
    (J->fold).ins.field_0.ot = uVar4 | 0x3c80;
    (J->fold).ins.field_0.op1 = IVar5;
    (J->fold).ins.field_0.op2 = uVar3;
    TVar6 = lj_opt_fold(J);
    IVar5 = (IRRef1)TVar6;
    (J->fold).ins.field_0.ot = 0x2a09;
    (J->fold).ins.field_0.op1 = IVar5;
    (J->fold).ins.field_0.op2 = 0x8000;
    TVar6 = lj_opt_fold(J);
    TVar8 = lj_ir_kint64(J,(ulong)((J->baseslot + J->maxslot) * 8));
    (J->fold).ins.field_0.ot = 0x789;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
    lj_opt_fold(J);
  }
  else {
    uVar4 = 0x80;
    if ((needbarrier & 0xffffU) < 0x8000) {
      uVar4 = 0;
    }
    (J->fold).ins.field_0.ot = uVar4 | 0x3d09;
    (J->fold).ins.field_0.op1 = IVar5;
    (J->fold).ins.field_0.op2 = uVar3;
    TVar6 = lj_opt_fold(J);
    IVar5 = (IRRef1)TVar6;
    bVar2 = true;
  }
  if (val == 0) {
    puVar1 = (undefined8 *)(uvp_00->v).ptr64;
    if ((uint)((long)*puVar1 >> 0x2f) < 0xfffffff2) {
      local_14 = 0xe;
    }
    else {
      local_14 = (uint)((long)*puVar1 >> 0x2f) ^ 0xffffffff;
    }
    (J->fold).ins.field_0.ot = (ushort)local_14 | 0x4480;
    (J->fold).ins.field_0.op1 = IVar5;
    (J->fold).ins.field_0.op2 = 0;
    local_124 = lj_opt_fold(J);
    if (local_14 < 3) {
      local_124 = local_14 * 0xffffff + 0x7fff;
    }
    J_local._4_4_ = local_124;
  }
  else {
    uvp._0_4_ = val;
    if ((val >> 0x18 & 0x1f) - 0xf < 5) {
      (J->fold).ins.field_0.ot = 0x5b0e;
      (J->fold).ins.field_0.op1 = (IRRef1)val;
      (J->fold).ins.field_0.op2 = 0x1d3;
      uvp._0_4_ = lj_opt_fold(J);
    }
    (J->fold).ins.field_0.ot = (byte)((TRef)uvp >> 0x18) & 0x1f | 0x4c00;
    (J->fold).ins.field_0.op1 = IVar5;
    (J->fold).ins.field_0.op2 = (IRRef1)(TRef)uvp;
    lj_opt_fold(J);
    if ((bVar2) && (((TRef)uvp >> 0x18 & 0x1f) - 4 < 9)) {
      (J->fold).ins.field_0.ot = 0x5900;
      (J->fold).ins.field_0.op1 = IVar5;
      (J->fold).ins.field_0.op2 = (IRRef1)(TRef)uvp;
      lj_opt_fold(J);
    }
    J->needsnap = '\x01';
    J_local._4_4_ = 0;
  }
  return J_local._4_4_;
}

Assistant:

static TRef rec_upvalue(jit_State *J, uint32_t uv, TRef val)
{
  GCupval *uvp = &gcref(J->fn->l.uvptr[uv])->uv;
  TRef fn = getcurrf(J);
  IRRef uref;
  int needbarrier = 0;
  if (rec_upvalue_constify(J, uvp)) {  /* Try to constify immutable upvalue. */
    TRef tr, kfunc;
    lj_assertJ(val == 0, "bad usage");
    if (!tref_isk(fn)) {  /* Late specialization of current function. */
      if (J->pt->flags >= PROTO_CLC_POLY)
	goto noconstify;
      kfunc = lj_ir_kfunc(J, J->fn);
      emitir(IRTG(IR_EQ, IRT_FUNC), fn, kfunc);
#if LJ_FR2
      J->base[-2] = kfunc;
#else
      J->base[-1] = kfunc | TREF_FRAME;
#endif
      fn = kfunc;
    }
    tr = lj_record_constify(J, uvval(uvp));
    if (tr)
      return tr;
  }
noconstify:
  /* Note: this effectively limits LJ_MAX_UPVAL to 127. */
  uv = (uv << 8) | (hashrot(uvp->dhash, uvp->dhash + HASH_BIAS) & 0xff);
  if (!uvp->closed) {
    /* In current stack? */
    if (uvval(uvp) >= tvref(J->L->stack) &&
	uvval(uvp) < tvref(J->L->maxstack)) {
      int32_t slot = (int32_t)(uvval(uvp) - (J->L->base - J->baseslot));
      if (slot >= 0) {  /* Aliases an SSA slot? */
	uref = tref_ref(emitir(IRT(IR_UREFO, IRT_PGC), fn, uv));
	emitir(IRTG(IR_EQ, IRT_PGC),
	       REF_BASE,
	       emitir(IRT(IR_ADD, IRT_PGC), uref,
		      lj_ir_kintpgc(J, (slot - 1 - LJ_FR2) * -8)));
	slot -= (int32_t)J->baseslot;  /* Note: slot number may be negative! */
	if (val == 0) {
	  return getslot(J, slot);
	} else {
	  J->base[slot] = val;
	  if (slot >= (int32_t)J->maxslot) J->maxslot = (BCReg)(slot+1);
	  return 0;
	}
      }
    }
    /* IR_UREFO+IRT_IGC is not checked for open-ness at runtime.
    ** Always marked as a guard, since it might get promoted to IRT_PGC later.
    */
    uref = emitir(IRTG(IR_UREFO, tref_isgcv(val) ? IRT_PGC : IRT_IGC), fn, uv);
    uref = tref_ref(uref);
    emitir(IRTG(IR_UGT, IRT_PGC),
	   emitir(IRT(IR_SUB, IRT_PGC), uref, REF_BASE),
	   lj_ir_kintpgc(J, (J->baseslot + J->maxslot) * 8));
  } else {
    /* If fn is constant, then so is the GCupval*, and the upvalue cannot
    ** transition back to open, so no guard is required in this case.
    */
    IRType t = (tref_isk(fn) ? 0 : IRT_GUARD) | IRT_PGC;
    uref = tref_ref(emitir(IRT(IR_UREFC, t), fn, uv));
    needbarrier = 1;
  }
  if (val == 0) {  /* Upvalue load */
    IRType t = itype2irt(uvval(uvp));
    TRef res = emitir(IRTG(IR_ULOAD, t), uref, 0);
    if (irtype_ispri(t)) res = TREF_PRI(t);  /* Canonicalize primitive refs. */
    return res;
  } else {  /* Upvalue store. */
    /* Convert int to number before storing. */
    if (!LJ_DUALNUM && tref_isinteger(val))
      val = emitir(IRTN(IR_CONV), val, IRCONV_NUM_INT);
    emitir(IRT(IR_USTORE, tref_type(val)), uref, val);
    if (needbarrier && tref_isgcv(val))
      emitir(IRT(IR_OBAR, IRT_NIL), uref, val);
    J->needsnap = 1;
    return 0;
  }
}